

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O0

boolean get_dht(j_decompress_ptr cinfo)

{
  byte bVar1;
  undefined8 *puVar2;
  long lVar3;
  undefined8 *puVar4;
  int iVar5;
  uint uVar6;
  j_common_ptr cinfo_00;
  JHUFF_TBL *pJVar7;
  long *in_RDI;
  int *_mp_1;
  int *_mp;
  size_t bytes_in_buffer;
  JOCTET *next_input_byte;
  jpeg_source_mgr *datasrc;
  JHUFF_TBL **htblptr;
  int count;
  int index;
  int i;
  UINT8 huffval [256];
  UINT8 bits [17];
  JLONG length;
  long local_168;
  byte *local_160;
  long *local_150;
  int local_144;
  int local_13c;
  byte local_138 [256];
  byte local_38 [4];
  byte bStack_34;
  byte bStack_33;
  byte bStack_32;
  byte bStack_31;
  byte local_30;
  byte bStack_2f;
  byte bStack_2e;
  byte bStack_2d;
  byte bStack_2c;
  byte bStack_2b;
  byte bStack_2a;
  byte bStack_29;
  byte local_28;
  long local_18;
  long *local_10;
  
  puVar2 = (undefined8 *)in_RDI[5];
  local_160 = (byte *)*puVar2;
  local_168 = puVar2[1];
  local_10 = in_RDI;
  if (local_168 == 0) {
    iVar5 = (*(code *)puVar2[3])(in_RDI);
    if (iVar5 == 0) {
      return 0;
    }
    local_160 = (byte *)*puVar2;
    local_168 = puVar2[1];
  }
  local_168 = local_168 + -1;
  local_18 = (ulong)*local_160 << 8;
  local_160 = local_160 + 1;
  if (local_168 == 0) {
    iVar5 = (*(code *)puVar2[3])(local_10);
    if (iVar5 == 0) {
      return 0;
    }
    local_160 = (byte *)*puVar2;
    local_168 = puVar2[1];
  }
  local_168 = local_168 + -1;
  local_18 = (ulong)*local_160 + local_18 + -2;
  local_160 = local_160 + 1;
  do {
    if (local_18 < 0x11) {
      if (local_18 != 0) {
        *(undefined4 *)(*local_10 + 0x28) = 0xb;
        (**(code **)*local_10)(local_10);
      }
      *puVar2 = local_160;
      puVar2[1] = local_168;
      return 1;
    }
    if (local_168 == 0) {
      iVar5 = (*(code *)puVar2[3])(local_10);
      if (iVar5 == 0) {
        return 0;
      }
      local_160 = (byte *)*puVar2;
      local_168 = puVar2[1];
    }
    bVar1 = *local_160;
    uVar6 = (uint)bVar1;
    *(undefined4 *)(*local_10 + 0x28) = 0x50;
    *(uint *)(*local_10 + 0x2c) = uVar6;
    (**(code **)(*local_10 + 8))(local_10,1);
    local_38[0] = 0;
    local_144 = 0;
    local_13c = 1;
    while( true ) {
      local_160 = local_160 + 1;
      local_168 = local_168 + -1;
      if (0x10 < local_13c) break;
      if (local_168 == 0) {
        iVar5 = (*(code *)puVar2[3])(local_10);
        if (iVar5 == 0) {
          return 0;
        }
        local_160 = (byte *)*puVar2;
        local_168 = puVar2[1];
      }
      local_38[local_13c] = *local_160;
      local_144 = (uint)local_38[local_13c] + local_144;
      local_13c = local_13c + 1;
    }
    local_18 = local_18 + -0x11;
    lVar3 = *local_10;
    cinfo_00 = (j_common_ptr)(lVar3 + 0x2c);
    *(uint *)&cinfo_00->err = (uint)local_38[1];
    *(uint *)(lVar3 + 0x30) = (uint)local_38[2];
    *(uint *)(lVar3 + 0x34) = (uint)local_38[3];
    *(uint *)(lVar3 + 0x38) = (uint)bStack_34;
    *(uint *)(lVar3 + 0x3c) = (uint)bStack_33;
    *(uint *)(lVar3 + 0x40) = (uint)bStack_32;
    *(uint *)(lVar3 + 0x44) = (uint)bStack_31;
    *(uint *)(lVar3 + 0x48) = (uint)local_30;
    *(undefined4 *)(*local_10 + 0x28) = 0x56;
    (**(code **)(*local_10 + 8))(local_10,2);
    lVar3 = *local_10;
    *(uint *)(lVar3 + 0x2c) = (uint)bStack_2f;
    *(uint *)(lVar3 + 0x30) = (uint)bStack_2e;
    *(uint *)(lVar3 + 0x34) = (uint)bStack_2d;
    *(uint *)(lVar3 + 0x38) = (uint)bStack_2c;
    *(uint *)(lVar3 + 0x3c) = (uint)bStack_2b;
    *(uint *)(lVar3 + 0x40) = (uint)bStack_2a;
    *(uint *)(lVar3 + 0x44) = (uint)bStack_29;
    *(uint *)(lVar3 + 0x48) = (uint)local_28;
    *(undefined4 *)(*local_10 + 0x28) = 0x56;
    (**(code **)(*local_10 + 8))(local_10);
    if ((0x100 < local_144) || (local_18 < local_144)) {
      *(undefined4 *)(*local_10 + 0x28) = 8;
      (**(code **)*local_10)(local_10);
    }
    for (local_13c = 0; local_13c < local_144; local_13c = local_13c + 1) {
      if (local_168 == 0) {
        iVar5 = (*(code *)puVar2[3])(local_10);
        if (iVar5 == 0) {
          return 0;
        }
        local_160 = (byte *)*puVar2;
        local_168 = puVar2[1];
      }
      local_168 = local_168 + -1;
      local_138[local_13c] = *local_160;
      local_160 = local_160 + 1;
    }
    memset(local_138 + local_144,0,(long)(0x100 - local_144));
    local_18 = local_18 - local_144;
    if ((bVar1 & 0x10) == 0) {
      if (3 < uVar6) {
        *(undefined4 *)(*local_10 + 0x28) = 0x1e;
        *(uint *)(*local_10 + 0x2c) = uVar6;
        (**(code **)*local_10)(local_10);
      }
      local_150 = local_10 + (long)(int)uVar6 + 0x1d;
    }
    else {
      iVar5 = uVar6 - 0x10;
      if ((iVar5 < 0) || (3 < iVar5)) {
        *(undefined4 *)(*local_10 + 0x28) = 0x1e;
        *(int *)(*local_10 + 0x2c) = iVar5;
        (**(code **)*local_10)(local_10);
      }
      local_150 = local_10 + (long)iVar5 + 0x21;
    }
    if (*local_150 == 0) {
      pJVar7 = jpeg_alloc_huff_table(cinfo_00);
      *local_150 = (long)pJVar7;
    }
    puVar4 = (undefined8 *)*local_150;
    *puVar4 = CONCAT17(bStack_31,
                       CONCAT16(bStack_32,
                                CONCAT15(bStack_33,
                                         CONCAT14(bStack_34,
                                                  CONCAT13(local_38[3],
                                                           CONCAT12(local_38[2],
                                                                    CONCAT11(local_38[1],local_38[0]
                                                                            )))))));
    puVar4[1] = CONCAT17(bStack_29,
                         CONCAT16(bStack_2a,
                                  CONCAT15(bStack_2b,
                                           CONCAT14(bStack_2c,
                                                    CONCAT13(bStack_2d,
                                                             CONCAT12(bStack_2e,
                                                                      CONCAT11(bStack_2f,local_30)))
                                                   ))));
    *(byte *)(puVar4 + 2) = local_28;
    memcpy((void *)(*local_150 + 0x11),local_138,0x100);
  } while( true );
}

Assistant:

LOCAL(boolean)
get_dht(j_decompress_ptr cinfo)
/* Process a DHT marker */
{
  JLONG length;
  UINT8 bits[17];
  UINT8 huffval[256];
  int i, index, count;
  JHUFF_TBL **htblptr;
  INPUT_VARS(cinfo);

  INPUT_2BYTES(cinfo, length, return FALSE);
  length -= 2;

  while (length > 16) {
    INPUT_BYTE(cinfo, index, return FALSE);

    TRACEMS1(cinfo, 1, JTRC_DHT, index);

    bits[0] = 0;
    count = 0;
    for (i = 1; i <= 16; i++) {
      INPUT_BYTE(cinfo, bits[i], return FALSE);
      count += bits[i];
    }

    length -= 1 + 16;

    TRACEMS8(cinfo, 2, JTRC_HUFFBITS,
             bits[1], bits[2], bits[3], bits[4],
             bits[5], bits[6], bits[7], bits[8]);
    TRACEMS8(cinfo, 2, JTRC_HUFFBITS,
             bits[9], bits[10], bits[11], bits[12],
             bits[13], bits[14], bits[15], bits[16]);

    /* Here we just do minimal validation of the counts to avoid walking
     * off the end of our table space.  jdhuff.c will check more carefully.
     */
    if (count > 256 || ((JLONG)count) > length)
      ERREXIT(cinfo, JERR_BAD_HUFF_TABLE);

    for (i = 0; i < count; i++)
      INPUT_BYTE(cinfo, huffval[i], return FALSE);

    MEMZERO(&huffval[count], (256 - count) * sizeof(UINT8));

    length -= count;

    if (index & 0x10) {         /* AC table definition */
      index -= 0x10;
      if (index < 0 || index >= NUM_HUFF_TBLS)
        ERREXIT1(cinfo, JERR_DHT_INDEX, index);
      htblptr = &cinfo->ac_huff_tbl_ptrs[index];
    } else {                    /* DC table definition */
      if (index < 0 || index >= NUM_HUFF_TBLS)
        ERREXIT1(cinfo, JERR_DHT_INDEX, index);
      htblptr = &cinfo->dc_huff_tbl_ptrs[index];
    }

    if (*htblptr == NULL)
      *htblptr = jpeg_alloc_huff_table((j_common_ptr)cinfo);

    MEMCOPY((*htblptr)->bits, bits, sizeof((*htblptr)->bits));
    MEMCOPY((*htblptr)->huffval, huffval, sizeof((*htblptr)->huffval));
  }

  if (length != 0)
    ERREXIT(cinfo, JERR_BAD_LENGTH);

  INPUT_SYNC(cinfo);
  return TRUE;
}